

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventDispatcher.cpp
# Opt level: O0

void __thiscall EventDispatcherHelper::lookupListeners(EventDispatcherHelper *this,Event *ev)

{
  int iVar1;
  bool bVar2;
  Id IVar3;
  EventListenerNode **ppEVar4;
  IEventListener *listener;
  undefined1 local_28 [16];
  iterator i;
  Event *ev_local;
  EventDispatcherHelper *this_local;
  
  i.mNode = (Node *)ev;
  JetHead::list<EventDispatcherHelper::EventListenerNode_*>::begin
            ((list<EventDispatcherHelper::EventListenerNode_*> *)(local_28 + 8));
  while( true ) {
    JetHead::list<EventDispatcherHelper::EventListenerNode_*>::end
              ((list<EventDispatcherHelper::EventListenerNode_*> *)local_28);
    bVar2 = JetHead::list<EventDispatcherHelper::EventListenerNode_*>::iterator::operator!=
                      ((iterator *)(local_28 + 8),(iterator *)local_28);
    JetHead::list<EventDispatcherHelper::EventListenerNode_*>::iterator::~iterator
              ((iterator *)local_28);
    if (!bVar2) break;
    ppEVar4 = JetHead::list<EventDispatcherHelper::EventListenerNode_*>::iterator::operator*
                        ((iterator *)(local_28 + 8));
    if ((*ppEVar4)->mListener == (IEventListener *)0x0) {
      ppEVar4 = JetHead::list<EventDispatcherHelper::EventListenerNode_*>::iterator::operator*
                          ((iterator *)(local_28 + 8));
      if (*ppEVar4 != (EventListenerNode *)0x0) {
        operator_delete(*ppEVar4,0x10);
      }
      JetHead::list<EventDispatcherHelper::EventListenerNode_*>::iterator::erase
                ((iterator *)&listener);
      local_28._8_8_ = listener;
      JetHead::list<EventDispatcherHelper::EventListenerNode_*>::iterator::~iterator
                ((iterator *)&listener);
      JetHead::list<EventDispatcherHelper::EventListenerNode_*>::iterator::operator--
                ((iterator *)(local_28 + 8));
    }
    else {
      ppEVar4 = JetHead::list<EventDispatcherHelper::EventListenerNode_*>::iterator::operator*
                          ((iterator *)(local_28 + 8));
      iVar1 = (*ppEVar4)->mEventId;
      IVar3 = Event::getEventId((Event *)i.mNode);
      if ((iVar1 == IVar3) ||
         (ppEVar4 = JetHead::list<EventDispatcherHelper::EventListenerNode_*>::iterator::operator*
                              ((iterator *)(local_28 + 8)), (*ppEVar4)->mEventId == -1)) {
        ppEVar4 = JetHead::list<EventDispatcherHelper::EventListenerNode_*>::iterator::operator*
                            ((iterator *)(local_28 + 8));
        (*(code *)**(undefined8 **)(*ppEVar4)->mListener)((*ppEVar4)->mListener,i.mNode);
      }
    }
    JetHead::list<EventDispatcherHelper::EventListenerNode_*>::iterator::operator++
              ((iterator *)(local_28 + 8));
  }
  JetHead::list<EventDispatcherHelper::EventListenerNode_*>::iterator::~iterator
            ((iterator *)(local_28 + 8));
  return;
}

Assistant:

void EventDispatcherHelper::lookupListeners( Event *ev )
{
	for (JetHead::list<EventListenerNode*>::iterator i = mEventList.begin();
		 i != mEventList.end(); ++i)
	{
		// Prune dead listener nodes
		if ( (*i)->mListener == NULL )
		{
			delete *i;
			i = i.erase();
			--i;
		}
		else if ( (*i)->mEventId == ev->getEventId() || 
				  (*i)->mEventId == Event::kInvalidEventId )
		{
			IEventListener *listener = (*i)->mListener;
			listener->receiveEvent( ev );
		}
	}	
}